

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RelativeWorldCoordinates *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  RelativeWorldCoordinates *local_18;
  RelativeWorldCoordinates *this_local;
  
  local_18 = this;
  this_local = (RelativeWorldCoordinates *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Relative World Coordinates");
  poVar1 = std::operator<<(poVar1,"\n\tReference Point: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16RefPnt);
  poVar1 = std::operator<<(poVar1,", Delta-X: ");
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelX);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,", Delta-Y: ");
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelY);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,", Delta-Z: ");
  KVar2 = KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_DelZ);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString RelativeWorldCoordinates::GetAsString() const
{
    KStringStream ss;

    ss << "Relative World Coordinates"
       << "\n\tReference Point: " << m_ui16RefPnt
       << ", Delta-X: " << m_DelX.GetAsFloat32()
       << ", Delta-Y: " << m_DelY.GetAsFloat32()
       << ", Delta-Z: " << m_DelZ.GetAsFloat32()
       << "\n";

    return ss.str();
}